

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O0

string * __thiscall
czh::value::details::get_typename_abi_cxx11_(string *__return_storage_ptr__,details *this,size_t sz)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  int iVar1;
  reference __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1f0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_14d;
  undefined1 local_14c;
  allocator<char> local_14b;
  allocator<char> local_14a;
  allocator<char> local_149;
  allocator<char> local_148;
  allocator<char> local_147;
  allocator<char> local_146;
  allocator<char> local_145 [20];
  allocator<char> local_131;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  undefined1 local_28 [24];
  size_t sz_local;
  
  local_28._16_8_ = this;
  sz_local = (size_t)__return_storage_ptr__;
  if (get_typename[abi:cxx11](unsigned_long)::names_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&get_typename[abi:cxx11](unsigned_long)::names_abi_cxx11_);
    if (iVar1 != 0) {
      local_14c = 1;
      local_130 = &local_128;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"Null",&local_131);
      local_130 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_108,"int",local_145);
      local_130 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_e8,"long long",&local_146);
      local_130 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_c8,"double",&local_147);
      local_130 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_a8,"bool",&local_148);
      local_130 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_88,"std::string",&local_149);
      local_130 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_68,"czh::value::Reference",&local_14a);
      local_130 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_48,"czh::value::Array",&local_14b);
      local_14c = 0;
      local_28._0_8_ = &local_128;
      local_28._8_8_ = 8;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_14d);
      __l._M_len = local_28._8_8_;
      __l._M_array = (iterator)local_28._0_8_;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&get_typename[abi:cxx11](unsigned_long)::names_abi_cxx11_,__l,&local_14d);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_14d);
      local_1f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_28;
      do {
        local_1f0 = local_1f0 + -1;
        std::__cxx11::string::~string((string *)local_1f0);
      } while (local_1f0 != &local_128);
      std::allocator<char>::~allocator(&local_14b);
      std::allocator<char>::~allocator(&local_14a);
      std::allocator<char>::~allocator(&local_149);
      std::allocator<char>::~allocator(&local_148);
      std::allocator<char>::~allocator(&local_147);
      std::allocator<char>::~allocator(&local_146);
      std::allocator<char>::~allocator(local_145);
      std::allocator<char>::~allocator(&local_131);
      __cxa_atexit(std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~vector,&get_typename[abi:cxx11](unsigned_long)::names_abi_cxx11_,&__dso_handle
                  );
      __cxa_guard_release(&get_typename[abi:cxx11](unsigned_long)::names_abi_cxx11_);
    }
  }
  __str = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](&get_typename[abi:cxx11](unsigned_long)::names_abi_cxx11_,local_28._16_8_);
  std::__cxx11::string::string((string *)__return_storage_ptr__,__str);
  return __return_storage_ptr__;
}

Assistant:

std::string get_typename(size_t sz)
      {
        static std::vector<std::string>
            names{"Null", "int", "long long", "double", "bool", "std::string", "czh::value::Reference",
                  "czh::value::Array"};
        return names[sz];
      }